

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprintpreviewwidget.cpp
# Opt level: O2

int __thiscall QPrintPreviewWidgetPrivate::calcCurrentPage(QPrintPreviewWidgetPrivate *this)

{
  long lVar1;
  QGraphicsItem **ppQVar2;
  QWidget *this_00;
  long lVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  PageItem *pg;
  long in_FS_OFFSET;
  QRect QVar7;
  undefined1 auVar8 [16];
  int local_cc;
  QArrayDataPointer<QPoint> local_90;
  QRect local_78;
  QArrayDataPointer<QGraphicsItem_*> local_68;
  QRect local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_cc = this->curPage;
  this_00 = (QWidget *)QAbstractScrollArea::viewport();
  local_48 = QWidget::rect(this_00);
  local_68.size = -0x5555555555555556;
  local_68.d = (Data *)0xaaaaaaaaaaaaaaaa;
  local_68.ptr = (QGraphicsItem **)0xaaaaaaaaaaaaaaaa;
  QGraphicsView::items((QRect *)&local_68,(ItemSelectionMode)this->graphicsView);
  ppQVar2 = local_68.ptr;
  lVar3 = local_68.size << 3;
  iVar5 = 0;
  for (lVar6 = 0; lVar3 != lVar6; lVar6 = lVar6 + 8) {
    lVar1 = *(long *)((long)ppQVar2 + lVar6);
    QGraphicsItem::sceneBoundingRect();
    QGraphicsView::mapFromScene((QRectF *)&local_90);
    QVar7 = (QRect)QPolygon::boundingRect();
    local_78 = QVar7;
    auVar8 = QRect::operator&(&local_78,&local_48);
    QArrayDataPointer<QPoint>::~QArrayDataPointer(&local_90);
    iVar4 = ((auVar8._12_4_ - auVar8._4_4_) + 1) * ((auVar8._8_4_ - auVar8._0_4_) + 1);
    if (iVar5 < iVar4) {
      iVar5 = iVar4;
      local_cc = *(int *)(lVar1 + 0x10);
    }
    else if ((iVar4 == iVar5) && (iVar4 = *(int *)(lVar1 + 0x10), iVar4 < local_cc)) {
      local_cc = iVar4;
    }
  }
  QArrayDataPointer<QGraphicsItem_*>::~QArrayDataPointer(&local_68);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return local_cc;
}

Assistant:

int QPrintPreviewWidgetPrivate::calcCurrentPage()
{
    int maxArea = 0;
    int newPage = curPage;
    QRect viewRect = graphicsView->viewport()->rect();
    const QList<QGraphicsItem*> items = graphicsView->items(viewRect);
    for (auto *item : items) {
        PageItem* pg = static_cast<PageItem*>(item);
        QRect overlap = graphicsView->mapFromScene(pg->sceneBoundingRect()).boundingRect() & viewRect;
        int area = overlap.width() * overlap.height();
        if (area > maxArea) {
            maxArea = area;
            newPage = pg->pageNumber();
        } else if (area == maxArea && pg->pageNumber() < newPage) {
            newPage = pg->pageNumber();
        }
    }
    return newPage;
}